

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_intarray_t * ztast_intarray(ztast_t *ast,ztast_intarrayinner_t *inner)

{
  ztast_intarrayinner *in_RSI;
  long in_RDI;
  ztast_intarray_t *intarr;
  ztast_intarray_t *local_8;
  
  local_8 = (ztast_intarray_t *)(**(code **)(in_RDI + 8))(8,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_intarray_t *)0x0) {
    local_8 = (ztast_intarray_t *)0x0;
  }
  else {
    local_8->inner = in_RSI;
  }
  return local_8;
}

Assistant:

ztast_intarray_t *ztast_intarray(ztast_t *ast, ztast_intarrayinner_t *inner)
{
  ztast_intarray_t *intarr;

  assert(ast);
  /* inner may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_intarray\n");
#endif

  intarr = ZTAST_MALLOC(sizeof(*intarr));
  if (intarr == NULL)
    return NULL;

  intarr->inner = inner;

  return intarr;
}